

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,ExprList *pCNames,
                      Select *pSelect,int isTemp,int noErr)

{
  byte *pbVar1;
  sqlite3 *db;
  Table *pTVar2;
  Schema *pSVar3;
  Db *pDVar4;
  char *pcVar5;
  undefined8 uVar6;
  int iVar7;
  Select *pSVar8;
  ExprList *pEVar9;
  Schema **ppSVar10;
  long in_FS_OFFSET;
  Token *pName;
  DbFixer sFix;
  Token *local_b0;
  Parse *local_a8;
  Walker WStack_a0;
  Schema *pSStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  char *pcStack_60;
  char *local_58;
  Token *pTStack_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pTStack_50 = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  WStack_a0.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  pSStack_70 = (Schema *)&DAT_aaaaaaaaaaaaaaaa;
  WStack_a0.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  WStack_a0.walkerDepth = -0x55555556;
  WStack_a0.eCode = 0xaaaa;
  WStack_a0.mWFlags = 0xaaaa;
  WStack_a0.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  WStack_a0.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  WStack_a0.pParse = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  local_b0 = (Token *)0x0;
  db = pParse->db;
  if (pParse->nVar < 1) {
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTVar2 = pParse->pNewTable;
    if ((pTVar2 != (Table *)0x0) && (pParse->nErr == 0)) {
      pbVar1 = (byte *)((long)&pTVar2->tabFlags + 1);
      *pbVar1 = *pbVar1 | 2;
      sqlite3TwoPartName(pParse,pName1,pName2,&local_b0);
      if (pTVar2->pSchema == (Schema *)0x0) {
        iVar7 = -0x8000;
      }
      else {
        iVar7 = -1;
        ppSVar10 = &db->aDb->pSchema;
        do {
          iVar7 = iVar7 + 1;
          pSVar3 = *ppSVar10;
          ppSVar10 = ppSVar10 + 4;
        } while (pSVar3 != pTVar2->pSchema);
      }
      pDVar4 = pParse->db->aDb;
      pcStack_60 = pDVar4[iVar7].zDbSName;
      pSStack_70 = pDVar4[iVar7].pSchema;
      local_58 = "view";
      pTStack_50 = local_b0;
      local_68 = CONCAT31(local_68._1_3_,iVar7 == 1);
      WStack_a0.xExprCallback = fixExprCb;
      WStack_a0.xSelectCallback = fixSelectCb;
      WStack_a0.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
      WStack_a0.walkerDepth = 0;
      WStack_a0._36_4_ = WStack_a0._36_4_ & 0xffff0000;
      WStack_a0.u.pNC = (NameContext *)&local_a8;
      local_a8 = pParse;
      WStack_a0.pParse = pParse;
      iVar7 = sqlite3WalkSelect(&WStack_a0,pSelect);
      if (iVar7 == 0) {
        pbVar1 = (byte *)((long)&pSelect->selFlags + 2);
        *pbVar1 = *pbVar1 | 0x20;
        if (pParse->eParseMode < 2) {
          pSVar8 = sqlite3SelectDup(db,pSelect,1);
        }
        else {
          pSVar8 = pSelect;
          pSelect = (Select *)0x0;
        }
        (pTVar2->u).view.pSelect = pSVar8;
        pEVar9 = sqlite3ExprListDup(db,pCNames,1);
        pTVar2->pCheck = pEVar9;
        pTVar2->eTabType = '\x02';
        if (db->mallocFailed == '\0') {
          pcVar5 = (pParse->sLastToken).z;
          uVar6 = *(undefined8 *)&(pParse->sLastToken).n;
          local_48._8_4_ = 0;
          if (*pcVar5 != ';') {
            local_48._8_4_ = (undefined4)uVar6;
          }
          local_48._0_8_ = pBegin->z + (((int)pcVar5 + local_48._8_4_) - (int)pBegin->z);
          do {
            pbVar1 = (byte *)(local_48._0_8_ + -1);
            local_48._0_8_ = local_48._0_8_ + -1;
          } while ((""[*pbVar1] & 1) != 0);
          local_48._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_48._8_4_ = 1;
          sqlite3EndTable(pParse,(Token *)0x0,(Token *)local_48,0,(Select *)0x0);
        }
      }
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
  }
  if (pSelect != (Select *)0x0) {
    clearSelect(db,pSelect,1);
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprlistUnmap(pParse,pCNames);
  }
  if (pCNames != (ExprList *)0x0) {
    exprListDeleteNN(db,pCNames);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  ExprList *pCNames, /* Optional list of view column names */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    goto create_view_fail;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ) goto create_view_fail;

  /* Legacy versions of SQLite allowed the use of the magic "rowid" column
  ** on a view, even though views do not have rowids.  The following flag
  ** setting fixes this problem.  But the fix can be disabled by compiling
  ** with -DSQLITE_ALLOW_ROWID_IN_VIEW in case there are legacy apps that
  ** depend upon the old buggy behavior.  The ability can also be toggled
  ** using sqlite3_config(SQLITE_CONFIG_ROWID_IN_VIEW,...) */
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
  p->tabFlags |= sqlite3Config.mNoVisibleRowid; /* Optional. Allow by default */
#else
  p->tabFlags |= TF_NoVisibleRowid;             /* Never allow rowid in view */
#endif

  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ) goto create_view_fail;

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  pSelect->selFlags |= SF_View;
  if( IN_RENAME_OBJECT ){
    p->u.view.pSelect = pSelect;
    pSelect = 0;
  }else{
    p->u.view.pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  }
  p->pCheck = sqlite3ExprListDup(db, pCNames, EXPRDUP_REDUCE);
  p->eTabType = TABTYP_VIEW;
  if( db->mallocFailed ) goto create_view_fail;

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  assert( sEnd.z[0]!=0 || sEnd.n==0 );
  if( sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  assert( n>0 );
  z = pBegin->z;
  while( sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the schema table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);

create_view_fail:
  sqlite3SelectDelete(db, pSelect);
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprlistUnmap(pParse, pCNames);
  }
  sqlite3ExprListDelete(db, pCNames);
  return;
}